

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_4::Validator::OnMemoryGrowExpr(Validator *this,MemoryGrowExpr *expr)

{
  Var local_70;
  Enum local_24;
  MemoryGrowExpr *local_20;
  MemoryGrowExpr *expr_local;
  Validator *this_local;
  
  local_20 = expr;
  expr_local = (MemoryGrowExpr *)this;
  Var::Var(&local_70,&expr->memidx);
  local_24 = (Enum)SharedValidator::OnMemoryGrow
                             (&this->validator_,
                              &(expr->super_ExprMixin<(wabt::ExprType)31>).super_Expr.loc,&local_70)
  ;
  Result::operator|=(&this->result_,(Result)local_24);
  Var::~Var(&local_70);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnMemoryGrowExpr(MemoryGrowExpr* expr) {
  result_ |= validator_.OnMemoryGrow(expr->loc, expr->memidx);
  return Result::Ok;
}